

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeTree.cpp
# Opt level: O2

InplaceStr GetGenericAliasTypeName(ExpressionContext *ctx,InplaceStr baseName)

{
  int iVar1;
  undefined4 extraout_var;
  size_t sVar2;
  ulong uVar3;
  ulong uVar4;
  InplaceStr IVar5;
  
  uVar4 = (long)baseName.end - (long)baseName.begin;
  uVar3 = (ulong)((int)uVar4 + 2);
  iVar1 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,uVar3);
  IVar5.begin = (char *)CONCAT44(extraout_var,iVar1);
  *IVar5.begin = '@';
  uVar4 = uVar4 & 0xffffffff;
  memcpy(IVar5.begin + 1,baseName.begin,uVar4);
  IVar5.begin[uVar4 + 1] = '\0';
  sVar2 = strlen(IVar5.begin);
  if (sVar2 + 1 == uVar3) {
    IVar5.end = IVar5.begin + sVar2;
    return IVar5;
  }
  __assert_fail("strlen(name) + 1 == nameLength",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/TypeTree.cpp"
                ,0x16d,"InplaceStr GetGenericAliasTypeName(ExpressionContext &, InplaceStr)");
}

Assistant:

InplaceStr GetGenericAliasTypeName(ExpressionContext &ctx, InplaceStr baseName)
{
	unsigned nameLength = baseName.length() + 1 + 1;
	char *name = (char*)ctx.allocator->alloc(nameLength);

	char *pos = name;

	*pos++ = '@';

	memcpy(pos, baseName.begin, baseName.length());
	pos += baseName.length();

	*pos++ = 0;

	assert(strlen(name) + 1 == nameLength);
	return InplaceStr(name);
}